

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_unsigned_integer.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_char,2u,2u,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               unsigned_integer_t<unsigned_char,_2U,_2U> *fmt,character_t<char> *others,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,
               optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *others_6,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_7)

{
  bool bVar1;
  bool bVar2;
  value_type_conflict1 vVar3;
  
  vVar3 = '\0';
  bVar2 = true;
  while ((end->m_position != pos->m_position &&
         (0xf5 < (byte)(pos->m_cache[pos->m_position] - 0x3aU)))) {
    vVar3 = vVar3 * '\n' + pos->m_cache[pos->m_position] + 0xd0;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    bVar1 = !bVar2;
    bVar2 = false;
    if (bVar1) {
      *fmt->value = vVar3;
      bVar2 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
                        (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6,
                         others_7);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, unsigned_integer_t<UnsignedInt, MinLength, MaxLength>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < MaxLength)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos;
    }

    if (count < MinLength)
        return false;

    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}